

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O2

FT_Error cf2_decoder_parse_charstrings
                   (PS_Decoder *decoder,FT_Byte *charstring_base,FT_ULong charstring_len)

{
  CF2_F16Dot16 *darkenAmount;
  CF2_BlueRec *pCVar1;
  char cVar2;
  char cVar3;
  FT_Bool FVar4;
  FT_Bool FVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ushort uVar9;
  FT_Face pFVar10;
  FT_Driver pFVar11;
  CFF_GlyphSlot pCVar12;
  FT_Memory memory;
  CFF_SubFont pCVar13;
  FT_Service_CFFLoad pFVar14;
  FT_Pos FVar15;
  PS_Decoder *pPVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  FT_Bool FVar19;
  int iVar20;
  CF2_F16Dot16 CVar21;
  int iVar22;
  CF2_Font font;
  FT_Long FVar23;
  FT_Long FVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  FT_Bool FVar30;
  ulong uVar31;
  uint uVar32;
  int iVar33;
  CF2_BluesRec *pCVar34;
  bool bVar35;
  int iVar36;
  int iVar39;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  FT_UFast lenNormalizedV;
  undefined8 local_b8;
  int iStack_b0;
  int iStack_ac;
  ulong local_a8;
  FT_Error error;
  CF2_F16Dot16 local_9c;
  CF2_BluesRec *local_98;
  FT_Fixed *local_90;
  int local_84;
  char local_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  char cStack_78;
  char cStack_77;
  char cStack_76;
  char cStack_75;
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  CF2_BufferRec_ local_68;
  FT_Vector local_48;
  
  error = 0;
  FVar19 = (decoder->builder).is_t1;
  if ((FVar19 != '\0') && (decoder->current_subfont == (CFF_SubFont)0x0)) {
    return 8;
  }
  font = (CF2_Font)decoder->cf2_instance->data;
  if (font == (CF2_Font)0x0) {
    memory = (decoder->builder).memory;
    decoder->cf2_instance->finalizer = cf2_free_instance;
    font = (CF2_Font)ft_mem_alloc(memory,0x290,&error);
    decoder->cf2_instance->data = font;
    if (error != 0) {
      return 0x40;
    }
    font->memory = memory;
    if (FVar19 == '\0') {
      font->cffload = (FT_Service_CFFLoad)decoder->cff->cffload;
    }
    *(undefined8 *)&(font->outline).root.windingMomentum = 0;
    (font->outline).root.memory = (FT_Memory)0x0;
    (font->outline).root.error = (FT_Error *)0x0;
    (font->outline).decoder = (PS_Decoder *)0x0;
    (font->outline).root.quadTo = (CF2_Callback_Type)0x0;
    (font->outline).root.cubeTo = (CF2_Callback_Type)0x0;
    (font->outline).root.memory = memory;
    (font->outline).root.error = &font->error;
    (font->outline).root.moveTo = cf2_builder_moveTo;
    (font->outline).root.lineTo = cf2_builder_lineTo;
    (font->outline).root.cubeTo = cf2_builder_cubeTo;
  }
  font->decoder = decoder;
  (font->outline).decoder = decoder;
  pFVar10 = (decoder->builder).face;
  pFVar11 = pFVar10->driver;
  cVar2 = *(char *)((long)&pFVar11[1].root.clazz + 4);
  cVar3 = pFVar10->internal->no_stem_darkening;
  local_68.error = (FT_Error *)0x0;
  local_68.end = charstring_base + charstring_len;
  uStack_6c = 0;
  cStack_7c = '\0';
  cStack_7b = '\0';
  cStack_7a = '\0';
  cStack_79 = '\0';
  cStack_78 = '\0';
  cStack_77 = '\0';
  cStack_76 = '\0';
  cStack_75 = '\0';
  uStack_70 = 0;
  pCVar12 = (decoder->builder).glyph;
  FVar4 = pCVar12->hint;
  if (FVar4 == '\0') {
    iVar36 = 0x400;
    iVar39 = 0x400;
  }
  else {
    iVar36 = (int)pCVar12->x_scale + 0x20;
    iVar39 = (int)pCVar12->y_scale + 0x20;
    iVar36 = (int)(((uint)(iVar36 >> 0x1f) >> 0x1a) + iVar36) >> 6;
    iVar39 = (int)(((uint)(iVar39 >> 0x1f) >> 0x1a) + iVar39) >> 6;
  }
  FVar5 = pCVar12->scaled;
  local_80 = (char)iVar36;
  cStack_7f = (char)((uint)iVar36 >> 8);
  cStack_7e = (char)((uint)iVar36 >> 0x10);
  cStack_7d = (char)((uint)iVar36 >> 0x18);
  cStack_74 = (char)iVar39;
  cStack_73 = (char)((uint)iVar39 >> 8);
  cStack_72 = (char)((uint)iVar39 >> 0x10);
  cStack_71 = (char)((uint)iVar39 >> 0x18);
  if (FVar19 == '\0') {
    FVar30 = *(FT_Bool *)&pFVar10[4].glyph;
  }
  else {
    FVar30 = '\0';
  }
  font->isCFF2 = FVar30;
  font->isT1 = FVar19;
  uVar26 = (uint)(FVar4 != '\0');
  font->renderingFlags = uVar26;
  if ((FVar5 != '\0') && ((cVar3 == '\0' || ((cVar3 < '\0' && (cVar2 == '\0')))))) {
    font->renderingFlags = uVar26 | 2;
  }
  font->darkenParams[0] = *(FT_Int *)&pFVar11[1].root.library;
  font->darkenParams[1] = *(FT_Int *)((long)&pFVar11[1].root.library + 4);
  font->darkenParams[2] = *(FT_Int *)&pFVar11[1].root.memory;
  font->darkenParams[3] = *(FT_Int *)((long)&pFVar11[1].root.memory + 4);
  font->darkenParams[4] = *(FT_Int *)&pFVar11[1].clazz;
  font->darkenParams[5] = *(FT_Int *)((long)&pFVar11[1].clazz + 4);
  font->darkenParams[6] = *(FT_Int *)&pFVar11[1].faces_list.head;
  font->darkenParams[7] = *(FT_Int *)((long)&pFVar11[1].faces_list.head + 4);
  pFVar10 = (decoder->builder).face;
  uVar9 = pFVar10->units_per_EM;
  font->unitsPerEm = (uint)uVar9;
  local_68.start = charstring_base;
  local_68.ptr = charstring_base;
  if (FVar5 != '\0') {
    auVar37._0_4_ = -(uint)(0 < iVar36);
    auVar37._4_4_ = -(uint)(0 < iVar36);
    auVar37._8_4_ = -(uint)(0 < iVar39);
    auVar37._12_4_ = -(uint)(0 < iVar39);
    iVar20 = movmskpd((int)pFVar10,auVar37);
    if (iVar20 != 3) {
      return 0x24;
    }
    if ((short)uVar9 < 0) {
      return 0xa4;
    }
    local_b8 = CONCAT44(iVar39,iVar39);
    iStack_b0 = iVar39;
    iStack_ac = iVar39;
    FVar23 = FT_DivFix(0x7d00000,(ulong)uVar9 << 0x10);
    if ((int)(uint)FVar23 < iVar36) {
      return 0xa4;
    }
    if ((uint)FVar23 < (uint)local_b8) {
      return 0xa4;
    }
    decoder = font->decoder;
  }
  local_9c = 0;
  local_48.x = 0;
  local_48.y = 0;
  uVar25 = (ulong)(uint)font->syntheticEmboldeningAmountX;
  CVar21 = font->syntheticEmboldeningAmountY;
  lenNormalizedV = 0;
  local_90 = (FT_Fixed *)0x0;
  font->error = 0;
  pCVar13 = decoder->current_subfont;
  bVar35 = font->lastSubfont != pCVar13;
  if (bVar35) {
    font->lastSubfont = pCVar13;
  }
  if ((font->isT1 == '\0') && ((decoder->cff->vstore).dataCount != 0)) {
    pFVar14 = font->cffload;
    pFVar10 = (decoder->builder).face;
    local_b8 = uVar25;
    iVar36 = (*(code *)((pFVar10[3].glyph)->metrics).horiBearingX)
                       (pFVar10,&lenNormalizedV,0,&local_90);
    font->error = iVar36;
    if (iVar36 != 0) {
      return 3;
    }
    FVar19 = (*pFVar14->blend_check_vector)
                       (&pCVar13->blend,(pCVar13->private_dict).vsindex,lenNormalizedV,local_90);
    if (FVar19 != '\0') {
      (*pFVar14->load_private_dict)(decoder->cff,pCVar13,lenNormalizedV,local_90);
    }
    bVar35 = FVar19 != '\0' || bVar35;
    (font->blend).font = (pCVar13->blend).font;
    (font->blend).usedBV = '\0';
    font->vsindex = (pCVar13->private_dict).vsindex;
    font->lenNDV = lenNormalizedV;
    font->NDV = local_90;
    uVar25 = local_b8;
  }
  lVar27 = (ulong)(((decoder->builder).face)->size->metrics).y_ppem << 0x10;
  iVar36 = (int)lVar27;
  if (font->ppem != iVar36) {
    font->ppem = iVar36;
    bVar35 = true;
  }
  uVar26 = font->renderingFlags;
  font->hinted = (byte)uVar26 & 1;
  auVar38[0] = -(local_80 == (char)(font->currentTransform).a);
  auVar38[1] = -(cStack_7f == *(char *)((long)&(font->currentTransform).a + 1));
  auVar38[2] = -(cStack_7e == *(char *)((long)&(font->currentTransform).a + 2));
  auVar38[3] = -(cStack_7d == *(char *)((long)&(font->currentTransform).a + 3));
  auVar38[4] = -(cStack_7c == (char)(font->currentTransform).b);
  auVar38[5] = -(cStack_7b == *(char *)((long)&(font->currentTransform).b + 1));
  auVar38[6] = -(cStack_7a == *(char *)((long)&(font->currentTransform).b + 2));
  auVar38[7] = -(cStack_79 == *(char *)((long)&(font->currentTransform).b + 3));
  auVar38[8] = -(cStack_78 == (char)(font->currentTransform).c);
  auVar38[9] = -(cStack_77 == *(char *)((long)&(font->currentTransform).c + 1));
  auVar38[10] = -(cStack_76 == *(char *)((long)&(font->currentTransform).c + 2));
  auVar38[0xb] = -(cStack_75 == *(char *)((long)&(font->currentTransform).c + 3));
  auVar38[0xc] = -(cStack_74 == (char)(font->currentTransform).d);
  auVar38[0xd] = -(cStack_73 == *(char *)((long)&(font->currentTransform).d + 1));
  auVar38[0xe] = -(cStack_72 == *(char *)((long)&(font->currentTransform).d + 2));
  auVar38[0xf] = -(cStack_71 == *(char *)((long)&(font->currentTransform).d + 3));
  if ((ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) | (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe | (ushort)(auVar38[0xf] >> 7) << 0xf)
      != 0xffff) {
    uVar17 = CONCAT13(cStack_7d,CONCAT12(cStack_7e,CONCAT11(cStack_7f,local_80)));
    uVar18 = CONCAT13(cStack_75,CONCAT12(cStack_76,CONCAT11(cStack_77,cStack_78)));
    (font->currentTransform).a = uVar17;
    (font->currentTransform).b =
         (int)(CONCAT17(cStack_79,CONCAT16(cStack_7a,CONCAT15(cStack_7b,CONCAT14(cStack_7c,uVar17)))
                       ) >> 0x20);
    (font->currentTransform).c = uVar18;
    (font->currentTransform).d =
         (int)(CONCAT17(cStack_71,CONCAT16(cStack_72,CONCAT15(cStack_73,CONCAT14(cStack_74,uVar18)))
                       ) >> 0x20);
    (font->currentTransform).tx = 0;
    (font->currentTransform).ty = 0;
    uVar17 = CONCAT13(cStack_7d,CONCAT12(cStack_7e,CONCAT11(cStack_7f,local_80)));
    uVar18 = CONCAT13(cStack_75,CONCAT12(cStack_76,CONCAT11(cStack_77,cStack_78)));
    (font->innerTransform).a = uVar17;
    (font->innerTransform).b =
         (int)(CONCAT17(cStack_79,CONCAT16(cStack_7a,CONCAT15(cStack_7b,CONCAT14(cStack_7c,uVar17)))
                       ) >> 0x20);
    (font->innerTransform).c = uVar18;
    (font->innerTransform).d =
         (int)(CONCAT17(cStack_71,CONCAT16(cStack_72,CONCAT15(cStack_73,CONCAT14(cStack_74,uVar18)))
                       ) >> 0x20);
    (font->innerTransform).tx = uStack_70;
    (font->innerTransform).ty = uStack_6c;
    (font->outerTransform).a = 0x10000;
    (font->outerTransform).b = 0;
    (font->outerTransform).c = 0;
    (font->outerTransform).d = 0x10000;
    bVar35 = true;
  }
  uVar26 = uVar26 & 2;
  if (uVar26 == font->stemDarkened) {
    if (!bVar35) goto LAB_0014b27b;
  }
  else {
    font->stemDarkened = (FT_Bool)uVar26;
  }
  local_a8 = CONCAT44(local_a8._4_4_,CVar21);
  iVar39 = 1000;
  if (font->unitsPerEm != 0) {
    iVar39 = font->unitsPerEm;
  }
  FVar23 = 0x40000;
  if (0x40000 < iVar36) {
    FVar23 = lVar27;
  }
  iVar20 = (int)(0x3e80000 / (long)iVar39);
  iVar36 = (int)(decoder->current_subfont->private_dict).standard_height;
  CVar21 = iVar36 << 0x10;
  font->stdVW = CVar21;
  local_b8 = (ulong)iVar20;
  if (iVar36 << 0x10 < 1) {
    FVar24 = FT_DivFix(0x4b0000,local_b8);
    CVar21 = (CF2_F16Dot16)FVar24;
    font->stdVW = CVar21;
  }
  local_98 = (CF2_BluesRec *)font->darkenParams;
  if ((int)uVar25 < 1) {
    cf2_computeDarkening
              (iVar20,(CF2_F16Dot16)FVar23,CVar21,&font->darkenX,0,font->stemDarkened,
               (FT_Int *)local_98);
  }
  else {
    local_84 = iVar20;
    FVar24 = FT_DivFix((long)(iVar39 << 0x10),FVar23);
    if ((long)uVar25 <= FVar24) {
      uVar25 = FT_DivFix((long)(iVar39 << 0x10),FVar23);
    }
    font->darkenX = 0;
    iVar20 = local_84;
    if ((0x28e < local_84) && ((int)uVar25 != 0)) {
      font->darkenX =
           (CF2_F16Dot16)
           ((long)((ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 | uVar25 & 0xffffffff) / 2);
    }
  }
  FVar15 = (decoder->current_subfont->private_dict).standard_width;
  if ((short)FVar15 < 1) {
LAB_0014b087:
    FVar24 = 0x6e0000;
  }
  else {
    iVar39 = (int)FVar15;
    iVar22 = iVar39 * 0x20000;
    FVar24 = 0x4b0000;
    iVar36 = font->stdVW;
    if (iVar36 == iVar22 || SBORROW4(iVar36,iVar22) != iVar36 + iVar39 * -0x20000 < 0)
    goto LAB_0014b087;
  }
  FVar24 = FT_DivFix(FVar24,local_b8);
  font->stdHW = (CF2_F16Dot16)FVar24;
  darkenAmount = &font->darkenY;
  cf2_computeDarkening
            (iVar20,(CF2_F16Dot16)FVar23,(CF2_F16Dot16)FVar24,darkenAmount,(CF2_F16Dot16)local_a8,
             font->stemDarkened,&local_98->scale);
  bVar35 = true;
  if (font->darkenX == 0) {
    bVar35 = *darkenAmount != 0;
  }
  font->darkened = bVar35;
  font->reverseWinding = '\0';
  pPVar16 = font->decoder;
  local_b8 = 0;
  memset(&font->blues,0,0x150);
  (font->blues).scale = (font->innerTransform).d;
  FVar23 = FT_DivFix((pPVar16->current_subfont->private_dict).blue_scale,0x3e80000);
  (font->blues).blueScale = (CF2_F16Dot16)FVar23;
  pCVar13 = pPVar16->current_subfont;
  FVar15 = (pCVar13->private_dict).blue_fuzz;
  (font->blues).blueShift = (int)(pCVar13->private_dict).blue_shift << 0x10;
  (font->blues).blueFuzz = (int)FVar15 << 0x10;
  bVar6 = (pCVar13->private_dict).num_blue_values;
  local_a8 = (ulong)(pCVar13->private_dict).num_other_blues;
  bVar7 = (pCVar13->private_dict).num_family_blues;
  bVar8 = (pCVar13->private_dict).num_family_other_blues;
  if (((pCVar13->private_dict).language_group == 1) &&
     (((ulong)bVar6 == 0 ||
      ((((bVar6 == 4 && ((short)(pCVar13->private_dict).blue_values[0] < -0x78)) &&
        ((short)(pCVar13->private_dict).blue_values[1] < -0x78)) &&
       ((0x370 < (short)(pCVar13->private_dict).blue_values[2] &&
        (0x370 < (short)(pCVar13->private_dict).blue_values[3])))))))) {
    (font->blues).emBoxBottomEdge.csCoord = -0x780001;
    iVar36 = (font->blues).scale;
    lVar27 = (long)iVar36 * -0x780001;
    (font->blues).emBoxBottomEdge.dsCoord =
         ((int)((ulong)(lVar27 + 0x8000 + (lVar27 >> 0x3f)) >> 0x10) + 0x8000U & 0xffff0000) -
         0x8000;
    (font->blues).emBoxBottomEdge.scale = iVar36;
    (font->blues).emBoxBottomEdge.flags = 0x31;
    lVar27 = (long)font->darkenY * 2 + 0x3700001;
    (font->blues).emBoxTopEdge.csCoord = (CF2_F16Dot16)lVar27;
    lVar27 = lVar27 * iVar36;
    (font->blues).emBoxTopEdge.dsCoord =
         (int)((ulong)(lVar27 + 0x8000 + (lVar27 >> 0x3f)) >> 0x10) + 0x8000U & 0xffff0000 | 0x8000;
    (font->blues).emBoxTopEdge.scale = iVar36;
    (font->blues).emBoxTopEdge.flags = 0x32;
    (font->blues).doEmBoxHints = '\x01';
  }
  else {
    for (uVar25 = 0; uVar25 < bVar6; uVar25 = uVar25 + 2) {
      iVar36 = (int)(pCVar13->private_dict).blue_values[uVar25];
      iVar39 = iVar36 * 0x10000;
      uVar26 = (font->blues).count;
      (font->blues).zone[uVar26].csBottomEdge = iVar39;
      CVar21 = (int)(pCVar13->private_dict).blue_values[uVar25 + 1] * 0x10000;
      (font->blues).zone[uVar26].csTopEdge = CVar21;
      uVar32 = CVar21 + iVar36 * -0x10000;
      if (-1 < (int)uVar32) {
        pCVar1 = (font->blues).zone + uVar26;
        iVar36 = (int)local_b8;
        local_b8 = local_b8 & 0xffffffff;
        if (iVar36 < (int)uVar32) {
          local_b8 = (ulong)uVar32;
        }
        if (uVar25 != 0) {
          iVar36 = *darkenAmount;
          (font->blues).zone[uVar26].csTopEdge = CVar21 + iVar36 * 2;
          CVar21 = iVar39 + iVar36 * 2;
          pCVar1->csBottomEdge = CVar21;
        }
        (font->blues).zone[uVar26].bottomZone = uVar25 == 0;
        pCVar1->csFlatEdge = CVar21;
        (font->blues).count = uVar26 + 1;
      }
    }
    for (uVar25 = 0; uVar25 < local_a8; uVar25 = uVar25 + 2) {
      iVar36 = (int)(pCVar13->private_dict).other_blues[uVar25];
      uVar26 = (font->blues).count;
      (font->blues).zone[uVar26].csBottomEdge = iVar36 * 0x10000;
      iVar39 = (int)(pCVar13->private_dict).other_blues[uVar25 + 1] * 0x10000;
      (font->blues).zone[uVar26].csTopEdge = iVar39;
      uVar32 = iVar39 + iVar36 * -0x10000;
      if (-1 < (int)uVar32) {
        iVar36 = (int)local_b8;
        local_b8 = local_b8 & 0xffffffff;
        if (iVar36 < (int)uVar32) {
          local_b8 = (ulong)uVar32;
        }
        (font->blues).zone[uVar26].bottomZone = '\x01';
        (font->blues).zone[uVar26].csFlatEdge = iVar39;
        (font->blues).count = uVar26 + 1;
      }
    }
    local_98 = &font->blues;
    FVar23 = FT_DivFix(0x10000,(long)(font->blues).scale);
    local_a8 = (ulong)(font->blues).count;
    for (uVar25 = 0; uVar25 != local_a8; uVar25 = uVar25 + 1) {
      iVar36 = (font->blues).zone[uVar25].csFlatEdge;
      iVar39 = (int)FVar23;
      if ((font->blues).zone[uVar25].bottomZone == '\0') {
        iVar20 = 0x7fffffff;
        for (lVar27 = 0x44; lVar27 - 0x42U < (ulong)bVar7; lVar27 = lVar27 + 2) {
          iVar22 = (&(pCVar13->font_dict).version)[lVar27 * 2] * 0x10000 + *darkenAmount * 2;
          iVar33 = iVar36 - iVar22;
          iVar29 = -iVar33;
          if (0 < iVar33) {
            iVar29 = iVar33;
          }
          if (((iVar29 < iVar20) && (iVar29 < iVar39)) &&
             ((font->blues).zone[uVar25].csFlatEdge = iVar22, iVar20 = iVar29, iVar36 == iVar22))
          break;
        }
      }
      else {
        iVar20 = 0x7fffffff;
        for (uVar31 = 0; uVar31 < bVar8; uVar31 = uVar31 + 2) {
          iVar22 = (int)(pCVar13->private_dict).family_other_blues[uVar31 + 1];
          iVar33 = iVar22 * 0x10000;
          iVar29 = iVar36 + iVar22 * -0x10000;
          iVar22 = -iVar29;
          if (0 < iVar29) {
            iVar22 = iVar29;
          }
          if (((iVar22 < iVar20) && (iVar22 < iVar39)) &&
             ((font->blues).zone[uVar25].csFlatEdge = iVar33, iVar20 = iVar22, iVar36 == iVar33)) {
            iVar20 = 0;
            break;
          }
        }
        if (1 < bVar7) {
          iVar22 = (int)(pCVar13->private_dict).family_blues[1];
          iVar36 = iVar36 + iVar22 * -0x10000;
          iVar29 = -iVar36;
          if (0 < iVar36) {
            iVar29 = iVar36;
          }
          if ((iVar29 < iVar20) && (iVar29 < iVar39)) {
            (font->blues).zone[uVar25].csFlatEdge = iVar22 * 0x10000;
          }
        }
      }
    }
    iVar36 = (font->blues).blueScale;
    pCVar34 = local_98;
    if (0 < (int)local_b8) {
      uVar25 = local_b8 & 0xffffffff;
      FVar23 = FT_DivFix(0x10000,uVar25);
      pCVar34 = local_98;
      if (FVar23 < iVar36) {
        FVar23 = FT_DivFix(0x10000,uVar25);
        iVar36 = (int)FVar23;
        (font->blues).blueScale = iVar36;
      }
      else {
        iVar36 = (font->blues).blueScale;
      }
    }
    iVar39 = pCVar34->scale;
    if (iVar39 < iVar36) {
      (font->blues).suppressOvershoot = '\x01';
      FVar23 = FT_MulDiv(0x999a,(long)iVar39,(long)iVar36);
      iVar36 = 0x999a - (int)FVar23;
      if (0x7ffe < iVar36) {
        iVar36 = 0x7fff;
      }
      (font->blues).boost = iVar36;
    }
    if (font->stemDarkened != '\0') {
      (font->blues).boost = 0;
    }
    uVar26 = (font->blues).count;
    for (lVar27 = 0; (ulong)uVar26 * 0x14 - lVar27 != 0; lVar27 = lVar27 + 0x14) {
      lVar28 = (long)(font->blues).scale *
               (long)*(int *)((long)&(font->blues).zone[0].csFlatEdge + lVar27);
      iVar36 = (font->blues).boost;
      iVar39 = -iVar36;
      if ((&(font->blues).zone[0].bottomZone)[lVar27] == '\0') {
        iVar39 = iVar36;
      }
      *(uint *)((long)&(font->blues).zone[0].dsFlatEdge + lVar27) =
           (int)((ulong)((lVar28 >> 0x3f) + lVar28 + 0x8000) >> 0x10) + iVar39 + 0x8000U &
           0xffff0000;
    }
  }
LAB_0014b27b:
  if (font->error == 0) {
    font->reverseWinding = '\0';
    bVar35 = font->darkened == '\0';
    while( true ) {
      pPVar16 = (font->outline).decoder;
      (font->outline).root.windingMomentum = 0;
      FT_GlyphLoader_Rewind((pPVar16->builder).loader);
      cf2_interpT2CharString(font,&local_68,&(font->outline).root,&local_48,'\0',0,0,&local_9c);
      if (font->error != 0) break;
      if ((bVar35) || (-1 < (font->outline).root.windingMomentum)) {
        pPVar16 = (font->outline).decoder;
        ps_builder_close_contour(&pPVar16->builder);
        FT_GlyphLoader_Add((pPVar16->builder).loader);
        if (font->error != 0) {
          return 3;
        }
        pPVar16 = (font->outline).decoder;
        if ((pPVar16->builder).is_t1 == '\0') {
          *pPVar16->glyph_width = (long)(short)((uint)(local_9c + 0x8000) >> 0x10);
          return 0;
        }
        return 0;
      }
      font->reverseWinding = '\x01';
      bVar35 = true;
    }
  }
  return 3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cf2_decoder_parse_charstrings( PS_Decoder*  decoder,
                                 FT_Byte*     charstring_base,
                                 FT_ULong     charstring_len )
  {
    FT_Memory  memory;
    FT_Error   error = FT_Err_Ok;
    CF2_Font   font;

    FT_Bool    is_t1 = decoder->builder.is_t1;


    FT_ASSERT( decoder &&
               ( is_t1 || decoder->cff ) );

    if ( is_t1 && !decoder->current_subfont )
    {
      FT_ERROR(( "cf2_decoder_parse_charstrings (Type 1): "
                 "SubFont missing. Use `t1_make_subfont' first\n" ));
      return FT_THROW( Invalid_Table );
    }

    memory = decoder->builder.memory;

    /* CF2 data is saved here across glyphs */
    font = (CF2_Font)decoder->cf2_instance->data;

    /* on first glyph, allocate instance structure */
    if ( !decoder->cf2_instance->data )
    {
      decoder->cf2_instance->finalizer =
        (FT_Generic_Finalizer)cf2_free_instance;

      if ( FT_ALLOC( decoder->cf2_instance->data,
                     sizeof ( CF2_FontRec ) ) )
        return FT_THROW( Out_Of_Memory );

      font = (CF2_Font)decoder->cf2_instance->data;

      font->memory = memory;

      if ( !is_t1 )
        font->cffload = (FT_Service_CFFLoad)decoder->cff->cffload;

      /* initialize a client outline, to be shared by each glyph rendered */
      cf2_outline_init( &font->outline, font->memory, &font->error );
    }

    /* save decoder; it is a stack variable and will be different on each */
    /* call                                                               */
    font->decoder         = decoder;
    font->outline.decoder = decoder;

    {
      /* build parameters for Adobe engine */

      PS_Builder*  builder = &decoder->builder;
      PS_Driver    driver  = (PS_Driver)FT_FACE_DRIVER( builder->face );

      FT_Bool  no_stem_darkening_driver =
                 driver->no_stem_darkening;
      FT_Char  no_stem_darkening_font =
                 builder->face->internal->no_stem_darkening;

      /* local error */
      FT_Error       error2 = FT_Err_Ok;
      CF2_BufferRec  buf;
      CF2_Matrix     transform;
      CF2_F16Dot16   glyphWidth;

      FT_Bool  hinted;
      FT_Bool  scaled;


      /* FreeType has already looked up the GID; convert to         */
      /* `RegionBuffer', assuming that the input has been validated */
      FT_ASSERT( charstring_base + charstring_len >= charstring_base );

      FT_ZERO( &buf );
      buf.start =
      buf.ptr   = charstring_base;
      buf.end   = charstring_base + charstring_len;

      FT_ZERO( &transform );

      cf2_getScaleAndHintFlag( decoder,
                               &transform.a,
                               &transform.d,
                               &hinted,
                               &scaled );

      if ( is_t1 )
        font->isCFF2 = FALSE;
      else
      {
        /* copy isCFF2 boolean from TT_Face to CF2_Font */
        font->isCFF2 = ((TT_Face)builder->face)->is_cff2;
      }
      font->isT1 = is_t1;

      font->renderingFlags = 0;
      if ( hinted )
        font->renderingFlags |= CF2_FlagsHinted;
      if ( scaled && ( !no_stem_darkening_font        ||
                       ( no_stem_darkening_font < 0 &&
                         !no_stem_darkening_driver  ) ) )
        font->renderingFlags |= CF2_FlagsDarkened;

      font->darkenParams[0] = driver->darken_params[0];
      font->darkenParams[1] = driver->darken_params[1];
      font->darkenParams[2] = driver->darken_params[2];
      font->darkenParams[3] = driver->darken_params[3];
      font->darkenParams[4] = driver->darken_params[4];
      font->darkenParams[5] = driver->darken_params[5];
      font->darkenParams[6] = driver->darken_params[6];
      font->darkenParams[7] = driver->darken_params[7];

      /* now get an outline for this glyph;      */
      /* also get units per em to validate scale */
      font->unitsPerEm = (CF2_Int)cf2_getUnitsPerEm( decoder );

      if ( scaled )
      {
        error2 = cf2_checkTransform( &transform, font->unitsPerEm );
        if ( error2 )
          return error2;
      }

      error2 = cf2_getGlyphOutline( font, &buf, &transform, &glyphWidth );
      if ( error2 )
        return FT_ERR( Invalid_File_Format );

      cf2_setGlyphWidth( &font->outline, glyphWidth );

      return FT_Err_Ok;
    }
  }